

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cc
# Opt level: O0

void __thiscall muduo::Thread::setDefaultName(Thread *this)

{
  ulong uVar1;
  long in_RDI;
  char buf [32];
  int num;
  char local_38 [44];
  uint local_c;
  
  local_c = detail::AtomicIntegerT<int>::incrementAndGet((AtomicIntegerT<int> *)0x15006f);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) != 0) {
    snprintf(local_38,0x20,"Thread%d",(ulong)local_c);
    std::__cxx11::string::operator=((string *)(in_RDI + 0x38),local_38);
  }
  return;
}

Assistant:

void Thread::setDefaultName()
{
  int num = numCreated_.incrementAndGet();
  if (name_.empty())
  {
    char buf[32];
    snprintf(buf, sizeof buf, "Thread%d", num);
    name_ = buf;
  }
}